

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzrot::NodeIntStateIncrement
          (ChNodeFEAxyzrot *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  char *__function;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ChQuaternion<double> q_new;
  ChQuaternion<double> q_old;
  double *local_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  ChState *pCStack_90;
  ulong local_88;
  long local_78;
  double local_68;
  ChVector<double> local_60;
  ChQuaternion<double> local_48;
  undefined1 extraout_var [56];
  
  uVar6 = (ulong)off_x;
  local_78 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (local_78 <= (long)uVar6) {
LAB_00660236:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                  "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                 );
  }
  lVar1 = (Dv->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (lVar1 <= (long)(ulong)off_v) goto LAB_00660236;
  lVar2 = (x_new->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (lVar2 <= (long)uVar6) {
LAB_00660255:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  local_a8 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar3 = (Dv->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar4 = (x_new->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar4[uVar6] = local_a8[uVar6] + pdVar3[off_v];
  uVar6 = (ulong)(off_x + 1);
  if ((local_78 <= (long)uVar6) || (lVar1 <= (long)(ulong)(off_v + 1))) goto LAB_00660236;
  if (lVar2 <= (long)uVar6) goto LAB_00660255;
  pdVar4[uVar6] = local_a8[uVar6] + pdVar3[off_v + 1];
  uVar6 = (ulong)(off_x + 2);
  if ((local_78 <= (long)uVar6) || (lVar1 <= (long)(ulong)(off_v + 2))) goto LAB_00660236;
  if (lVar2 <= (long)uVar6) goto LAB_00660255;
  pdVar4[uVar6] = local_a8[uVar6] + pdVar3[off_v + 2];
  uVar6 = (ulong)(off_x + 3);
  local_a8 = local_a8 + uVar6;
  uStack_a0 = 4;
  pCStack_90 = x;
  local_88 = uVar6;
  if ((long)uVar6 <= local_78 + -4) {
    ChQuaternion<double>::
    ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_48,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_a8,(type *)0x0);
    local_88 = (ulong)(off_v + 3);
    local_a8 = (Dv->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               local_88;
    local_78 = (Dv->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    uStack_a0 = 3;
    pCStack_90 = (ChState *)Dv;
    if ((long)local_88 <= local_78 + -3) {
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_60,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_a8,(type *)0x0);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_60.m_data[0];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_60.m_data[1] * local_60.m_data[1];
      auVar10 = vfmadd231sd_fma(auVar10,auVar13,auVar13);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_60.m_data[2];
      auVar10 = vfmadd231sd_fma(auVar10,auVar19,auVar19);
      dVar9 = auVar10._0_8_;
      if (dVar9 <= 1e-30) {
        local_60.m_data[0] = local_60.m_data[0] * 0.5;
        local_60.m_data[1] = local_60.m_data[1] * 0.5;
        dVar9 = local_60.m_data[2] * 0.5;
        auVar10 = ZEXT816(0x3ff0000000000000);
      }
      else {
        if (dVar9 < 0.0) {
          dVar8 = sqrt(dVar9);
        }
        else {
          auVar10 = vsqrtsd_avx(auVar10,auVar10);
          dVar8 = auVar10._0_8_;
        }
        local_68 = dVar8 * 0.5;
        dVar9 = sin(local_68);
        dVar9 = dVar9 / dVar8;
        auVar12._0_8_ = cos(local_68);
        auVar12._8_56_ = extraout_var;
        auVar10 = auVar12._0_16_;
        local_60.m_data[0] = dVar9 * local_60.m_data[0];
        local_60.m_data[1] = dVar9 * local_60.m_data[1];
        dVar9 = dVar9 * local_60.m_data[2];
      }
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_48.m_data[0];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_48.m_data[1];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_60.m_data[0] * local_48.m_data[1];
      auVar13 = vfmsub231sd_fma(auVar22,auVar20,auVar10);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_48.m_data[2];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_60.m_data[1];
      auVar13 = vfnmadd231sd_fma(auVar13,auVar23,auVar14);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_48.m_data[3];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar9;
      auVar19 = vfnmadd231sd_fma(auVar13,auVar24,auVar17);
      dVar8 = auVar10._0_8_;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_60.m_data[0];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar8 * local_48.m_data[1];
      auVar10 = vfmadd231sd_fma(auVar25,auVar20,auVar16);
      auVar10 = vfnmadd231sd_fma(auVar10,auVar24,auVar14);
      auVar10 = vfmadd231sd_fma(auVar10,auVar23,auVar17);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_60.m_data[1];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar8 * local_48.m_data[2];
      auVar13 = vfmadd231sd_fma(auVar26,auVar20,auVar15);
      auVar13 = vfmadd231sd_fma(auVar13,auVar24,auVar16);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar9;
      auVar14 = vfnmadd231sd_fma(auVar13,auVar21,auVar18);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_48.m_data[3] * dVar8;
      auVar13 = vfmadd231sd_fma(auVar11,auVar20,auVar18);
      auVar13 = vfnmadd231sd_fma(auVar13,auVar23,auVar16);
      auVar13 = vfmadd231sd_fma(auVar13,auVar21,auVar15);
      local_a8 = auVar19._0_8_;
      uStack_a0 = auVar10._0_8_;
      uStack_98 = auVar14._0_8_;
      pCStack_90 = auVar13._0_8_;
      if ((long)uVar6 <=
          (x_new->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -4) {
        pdVar4 = (x_new->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        pdVar3 = pdVar4 + uVar6;
        uVar7 = 4;
        if ((((ulong)pdVar3 & 7) == 0) &&
           (uVar5 = (ulong)(-((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7), uVar5 < 4)) {
          uVar7 = uVar5;
        }
        if (uVar7 != 0) {
          memcpy(pdVar3,&local_a8,(ulong)(uint)((int)uVar7 * 8));
        }
        if (uVar7 < 4) {
          uVar5 = (ulong)(uint)((int)uVar7 * 8);
          memcpy(pdVar4 + uVar6 + uVar7,(void *)((long)&local_a8 + uVar5),0x20 - uVar5);
        }
        return;
      }
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_006602a0;
    }
  }
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_006602a0:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChNodeFEAxyzrot::NodeIntStateIncrement(const unsigned int off_x,
                                            ChState& x_new,
                                            const ChState& x,
                                            const unsigned int off_v,
                                            const ChStateDelta& Dv) {
    x_new(off_x) = x(off_x) + Dv(off_v);
    x_new(off_x + 1) = x(off_x + 1) + Dv(off_v + 1);
    x_new(off_x + 2) = x(off_x + 2) + Dv(off_v + 2);
    
    // ADVANCE ROTATION: R_new = DR_a * R_old 
    // (using quaternions, local or abs:  q_new = Dq_a * q_old =  q_old * Dq_l  )
    ChQuaternion<> q_old(x.segment(off_x + 3, 4));
    ChQuaternion<> rel_q; rel_q.Q_from_Rotv(Dv.segment(off_v + 3, 3));
    ChQuaternion<> q_new = q_old * rel_q;
    x_new.segment(off_x + 3, 4) = q_new.eigen();
}